

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::PopStyleVar(int count)

{
  ImPlotContext *pIVar1;
  ImGuiStyleMod *pIVar2;
  ImPlotStyleVarInfo *this;
  int *piVar3;
  void *data;
  ImPlotStyleVarInfo *info;
  ImGuiStyleMod *backup;
  ImPlotContext *gp;
  int count_local;
  
  pIVar1 = GImPlot;
  gp._4_4_ = count;
  if (count <= (GImPlot->StyleModifiers).Size) {
    for (; 0 < gp._4_4_; gp._4_4_ = gp._4_4_ + -1) {
      pIVar2 = ImVector<ImGuiStyleMod>::back(&pIVar1->StyleModifiers);
      this = GetPlotStyleVarInfo(pIVar2->VarIdx);
      piVar3 = (int *)ImPlotStyleVarInfo::GetVarPtr(this,&pIVar1->Style);
      if ((this->Type == 8) && (this->Count == 1)) {
        *piVar3 = (pIVar2->field_1).BackupInt[0];
      }
      else if ((this->Type == 8) && (this->Count == 2)) {
        *piVar3 = (pIVar2->field_1).BackupInt[0];
        piVar3[1] = (pIVar2->field_1).BackupInt[1];
      }
      else if ((this->Type == 4) && (this->Count == 1)) {
        *piVar3 = (pIVar2->field_1).BackupInt[0];
      }
      ImVector<ImGuiStyleMod>::pop_back(&pIVar1->StyleModifiers);
    }
    return;
  }
  __assert_fail("(count <= gp.StyleModifiers.Size) && \"You can\'t pop more modifiers than have been pushed!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xcdd,"void ImPlot::PopStyleVar(int)");
}

Assistant:

void PopStyleVar(int count) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(count <= gp.StyleModifiers.Size, "You can't pop more modifiers than have been pushed!");
    while (count > 0) {
        ImGuiStyleMod& backup = gp.StyleModifiers.back();
        const ImPlotStyleVarInfo* info = GetPlotStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&gp.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1) {
            ((float*)data)[0] = backup.BackupFloat[0];
        }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) {
             ((float*)data)[0] = backup.BackupFloat[0];
             ((float*)data)[1] = backup.BackupFloat[1];
        }
        else if (info->Type == ImGuiDataType_S32 && info->Count == 1) {
            ((int*)data)[0] = backup.BackupInt[0];
        }
        gp.StyleModifiers.pop_back();
        count--;
    }
}